

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool ts_lex_keywords(TSLexer *lexer,TSStateId state)

{
  uint uVar1;
  uint local_28;
  uint32_t i;
  int32_t lookahead;
  _Bool eof;
  _Bool skip;
  _Bool result;
  TSStateId state_local;
  TSLexer *lexer_local;
  
  lookahead._2_2_ = state;
  do {
    lookahead._0_1_ = false;
    uVar1 = lexer->lookahead;
    (*lexer->eof)(lexer);
    switch(lookahead._2_2_) {
    case 0:
      for (local_28 = 0; local_28 < 0x22; local_28 = local_28 + 2) {
        if (ts_lex_keywords::map[local_28] == uVar1) {
          lookahead._2_2_ = ts_lex_keywords::map[local_28 + 1];
          goto LAB_00105ab1;
        }
      }
      if ((((int)uVar1 < 9) || (0xd < (int)uVar1)) && (uVar1 != 0x20)) {
        return false;
      }
      lookahead._0_1_ = true;
      lookahead._2_2_ = 0;
      break;
    case 1:
      if (uVar1 != 0x55) {
        return false;
      }
      lookahead._2_2_ = 0x12;
      break;
    case 2:
      if (uVar1 == 0x6e) {
        lookahead._2_2_ = 0x13;
      }
      else {
        if (uVar1 != 0x74) {
          return false;
        }
        lookahead._2_2_ = 0x14;
      }
      break;
    case 3:
      if (uVar1 != 0x72) {
        return false;
      }
      lookahead._2_2_ = 0x15;
      break;
    case 4:
      if (uVar1 != 0x6f) {
        return false;
      }
      lookahead._2_2_ = 0x16;
      break;
    case 5:
      if (uVar1 != 0x6f) {
        return false;
      }
      lookahead._2_2_ = 0x17;
      break;
    case 6:
      if (uVar1 == 0x6c) {
        lookahead._2_2_ = 0x18;
      }
      else {
        if (uVar1 != 0x6e) {
          return false;
        }
        lookahead._2_2_ = 0x19;
      }
      break;
    case 7:
      if (uVar1 == 0x61) {
        lookahead._2_2_ = 0x1a;
      }
      else if (uVar1 == 0x69) {
        lookahead._2_2_ = 0x1b;
      }
      else if (uVar1 == 0x6f) {
        lookahead._2_2_ = 0x1c;
      }
      else {
        if (uVar1 != 0x75) {
          return false;
        }
        lookahead._2_2_ = 0x1d;
      }
      break;
    case 8:
      if (uVar1 == 0x66) {
        lookahead._2_2_ = 0x1e;
      }
      else {
        if (uVar1 != 0x6e) {
          return false;
        }
        lookahead._2_2_ = 0x1f;
      }
      break;
    case 9:
      if (uVar1 != 0x6f) {
        return false;
      }
      lookahead._2_2_ = 0x20;
      break;
    case 10:
      if (uVar1 != 0x6f) {
        return false;
      }
      lookahead._2_2_ = 0x21;
      break;
    case 0xb:
      if (uVar1 != 0x6f) {
        return false;
      }
      lookahead._2_2_ = 0x22;
      break;
    case 0xc:
      if (uVar1 == 100) {
        lookahead._2_2_ = 0x23;
      }
      else {
        if (uVar1 != 0x72) {
          return false;
        }
        lookahead._2_2_ = 0x24;
      }
      break;
    case 0xd:
      if (uVar1 != 0x75) {
        return false;
      }
      lookahead._2_2_ = 0x25;
      break;
    case 0xe:
      if (uVar1 != 0x65) {
        return false;
      }
      lookahead._2_2_ = 0x26;
      break;
    case 0xf:
      if (uVar1 == 0x68) {
        lookahead._2_2_ = 0x27;
      }
      else {
        if (uVar1 != 0x72) {
          return false;
        }
        lookahead._2_2_ = 0x28;
      }
      break;
    case 0x10:
      if (uVar1 != 0x6e) {
        return false;
      }
      lookahead._2_2_ = 0x29;
      break;
    case 0x11:
      if (uVar1 != 0x68) {
        return false;
      }
      lookahead._2_2_ = 0x2a;
      break;
    case 0x12:
      if (uVar1 != 0x49) {
        return false;
      }
      lookahead._2_2_ = 0x2b;
      break;
    case 0x13:
      if (uVar1 != 100) {
        return false;
      }
      lookahead._2_2_ = 0x2c;
      break;
    case 0x14:
      if (uVar1 != 0x6f) {
        return false;
      }
      lookahead._2_2_ = 0x2d;
      break;
    case 0x15:
      if (uVar1 != 0x65) {
        return false;
      }
      lookahead._2_2_ = 0x2e;
      break;
    case 0x16:
      if (uVar1 != 0x6e) {
        return false;
      }
      lookahead._2_2_ = 0x2f;
      break;
    case 0x17:
      lexer->result_symbol = 0xb;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x18:
      if (uVar1 == 0x69) {
        lookahead._2_2_ = 0x30;
      }
      else {
        if (uVar1 != 0x73) {
          return false;
        }
        lookahead._2_2_ = 0x31;
      }
      break;
    case 0x19:
      if (uVar1 != 100) {
        return false;
      }
      lookahead._2_2_ = 0x32;
      break;
    case 0x1a:
      if (uVar1 == 0x69) {
        lookahead._2_2_ = 0x33;
      }
      else {
        if (uVar1 != 0x6c) {
          return false;
        }
        lookahead._2_2_ = 0x34;
      }
      break;
    case 0x1b:
      lexer->result_symbol = 7;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x1c:
      if (uVar1 != 0x72) {
        return false;
      }
      lookahead._2_2_ = 0x35;
      break;
    case 0x1d:
      if (uVar1 != 0x6e) {
        return false;
      }
      lookahead._2_2_ = 0x36;
      break;
    case 0x1e:
      lexer->result_symbol = 5;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x1f:
      lexer->result_symbol = 0x10;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x20:
      if (uVar1 != 99) {
        return false;
      }
      lookahead._2_2_ = 0x37;
      break;
    case 0x21:
      if (uVar1 != 100) {
        return false;
      }
      lookahead._2_2_ = 0x38;
      break;
    case 0x22:
      if (uVar1 != 0x74) {
        return false;
      }
      lookahead._2_2_ = 0x39;
      break;
    case 0x23:
      lexer->result_symbol = 0xc;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x24:
      lexer->result_symbol = 0x1d;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x25:
      if (uVar1 != 0x69) {
        return false;
      }
      lookahead._2_2_ = 0x3a;
      break;
    case 0x26:
      if (uVar1 == 0x61) {
        lookahead._2_2_ = 0x3b;
      }
      else if (uVar1 == 99) {
        lookahead._2_2_ = 0x3c;
      }
      else if (uVar1 == 0x70) {
        lookahead._2_2_ = 0x3d;
      }
      else {
        if (uVar1 != 0x74) {
          return false;
        }
        lookahead._2_2_ = 0x3e;
      }
      break;
    case 0x27:
      if (uVar1 != 0x65) {
        return false;
      }
      lookahead._2_2_ = 0x3f;
      break;
    case 0x28:
      if (uVar1 != 0x75) {
        return false;
      }
      lookahead._2_2_ = 0x40;
      break;
    case 0x29:
      if (uVar1 != 0x74) {
        return false;
      }
      lookahead._2_2_ = 0x41;
      break;
    case 0x2a:
      if (uVar1 != 0x69) {
        return false;
      }
      lookahead._2_2_ = 0x42;
      break;
    case 0x2b:
      if (uVar1 != 0x54) {
        return false;
      }
      lookahead._2_2_ = 0x43;
      break;
    case 0x2c:
      lexer->result_symbol = 0x1e;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x2d:
      if (uVar1 != 0x6d) {
        return false;
      }
      lookahead._2_2_ = 0x44;
      break;
    case 0x2e:
      if (uVar1 != 0x61) {
        return false;
      }
      lookahead._2_2_ = 0x45;
      break;
    case 0x2f:
      if (uVar1 != 0x74) {
        return false;
      }
      lookahead._2_2_ = 0x46;
      break;
    case 0x30:
      if (uVar1 != 0x66) {
        return false;
      }
      lookahead._2_2_ = 0x47;
      break;
    case 0x31:
      if (uVar1 != 0x65) {
        return false;
      }
      lookahead._2_2_ = 0x48;
      break;
    case 0x32:
      lexer->result_symbol = 0x37;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x33:
      if (uVar1 != 0x6c) {
        return false;
      }
      lookahead._2_2_ = 0x49;
      break;
    case 0x34:
      if (uVar1 != 0x73) {
        return false;
      }
      lookahead._2_2_ = 0x4a;
      break;
    case 0x35:
      lexer->result_symbol = 0xf;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x36:
      if (uVar1 != 99) {
        return false;
      }
      lookahead._2_2_ = 0x4b;
      break;
    case 0x37:
      if (uVar1 != 0x61) {
        return false;
      }
      lookahead._2_2_ = 0x4c;
      break;
    case 0x38:
      lexer->result_symbol = 0x29;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x39:
      lexer->result_symbol = 0x2b;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x3a:
      if (uVar1 != 0x74) {
        return false;
      }
      lookahead._2_2_ = 0x43;
      break;
    case 0x3b:
      if (uVar1 != 100) {
        return false;
      }
      lookahead._2_2_ = 0x4d;
      break;
    case 0x3c:
      lexer->result_symbol = 0x3f;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x3d:
      if (uVar1 != 0x65) {
        return false;
      }
      lookahead._2_2_ = 0x4e;
      break;
    case 0x3e:
      if (uVar1 != 0x75) {
        return false;
      }
      lookahead._2_2_ = 0x4f;
      break;
    case 0x3f:
      if (uVar1 != 0x6e) {
        return false;
      }
      lookahead._2_2_ = 0x50;
      break;
    case 0x40:
      if (uVar1 != 0x65) {
        return false;
      }
      lookahead._2_2_ = 0x51;
      break;
    case 0x41:
      if (uVar1 != 0x69) {
        return false;
      }
      lookahead._2_2_ = 0x52;
      break;
    case 0x42:
      if (uVar1 != 0x6c) {
        return false;
      }
      lookahead._2_2_ = 0x53;
      break;
    case 0x43:
      lexer->result_symbol = 3;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x44:
      if (uVar1 != 0x69) {
        return false;
      }
      lookahead._2_2_ = 0x54;
      break;
    case 0x45:
      if (uVar1 != 0x6b) {
        return false;
      }
      lookahead._2_2_ = 0x55;
      break;
    case 0x46:
      if (uVar1 != 0x69) {
        return false;
      }
      lookahead._2_2_ = 0x56;
      break;
    case 0x47:
      lexer->result_symbol = 8;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x48:
      lexer->result_symbol = 9;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x49:
      lexer->result_symbol = 0x31;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x4a:
      if (uVar1 != 0x65) {
        return false;
      }
      lookahead._2_2_ = 0x57;
      break;
    case 0x4b:
      if (uVar1 != 0x74) {
        return false;
      }
      lookahead._2_2_ = 0x58;
      break;
    case 0x4c:
      if (uVar1 != 0x6c) {
        return false;
      }
      lookahead._2_2_ = 0x59;
      break;
    case 0x4d:
      if (uVar1 == 0x6f) {
        lookahead._2_2_ = 0x5a;
      }
      else {
        if (uVar1 != 0x77) {
          return false;
        }
        lookahead._2_2_ = 0x5b;
      }
      break;
    case 0x4e:
      if (uVar1 != 0x61) {
        return false;
      }
      lookahead._2_2_ = 0x5c;
      break;
    case 0x4f:
      if (uVar1 != 0x72) {
        return false;
      }
      lookahead._2_2_ = 0x5d;
      break;
    case 0x50:
      lexer->result_symbol = 6;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x51:
      lexer->result_symbol = 0x2f;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x52:
      if (uVar1 != 0x6c) {
        return false;
      }
      lookahead._2_2_ = 0x5e;
      break;
    case 0x53:
      if (uVar1 != 0x65) {
        return false;
      }
      lookahead._2_2_ = 0x5f;
      break;
    case 0x54:
      if (uVar1 != 99) {
        return false;
      }
      lookahead._2_2_ = 0x60;
      break;
    case 0x55:
      lexer->result_symbol = 0x13;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x56:
      if (uVar1 != 0x6e) {
        return false;
      }
      lookahead._2_2_ = 0x61;
      break;
    case 0x57:
      lexer->result_symbol = 0x30;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x58:
      if (uVar1 != 0x69) {
        return false;
      }
      lookahead._2_2_ = 0x62;
      break;
    case 0x59:
      lexer->result_symbol = 0x3c;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x5a:
      if (uVar1 != 0x6e) {
        return false;
      }
      lookahead._2_2_ = 99;
      break;
    case 0x5b:
      if (uVar1 != 0x72) {
        return false;
      }
      lookahead._2_2_ = 100;
      break;
    case 0x5c:
      if (uVar1 != 0x74) {
        return false;
      }
      lookahead._2_2_ = 0x65;
      break;
    case 0x5d:
      if (uVar1 != 0x6e) {
        return false;
      }
      lookahead._2_2_ = 0x66;
      break;
    case 0x5e:
      lexer->result_symbol = 0xe;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x5f:
      lexer->result_symbol = 10;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x60:
      lexer->result_symbol = 0x11;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x61:
      if (uVar1 != 0x75) {
        return false;
      }
      lookahead._2_2_ = 0x67;
      break;
    case 0x62:
      if (uVar1 != 0x6f) {
        return false;
      }
      lookahead._2_2_ = 0x68;
      break;
    case 99:
      if (uVar1 != 0x6c) {
        return false;
      }
      lookahead._2_2_ = 0x69;
      break;
    case 100:
      if (uVar1 != 0x69) {
        return false;
      }
      lookahead._2_2_ = 0x6a;
      break;
    case 0x65:
      lexer->result_symbol = 0xd;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x66:
      lexer->result_symbol = 0x15;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x67:
      if (uVar1 != 0x65) {
        return false;
      }
      lookahead._2_2_ = 0x6b;
      break;
    case 0x68:
      if (uVar1 != 0x6e) {
        return false;
      }
      lookahead._2_2_ = 0x6c;
      break;
    case 0x69:
      if (uVar1 != 0x79) {
        return false;
      }
      lookahead._2_2_ = 0x6d;
      break;
    case 0x6a:
      if (uVar1 != 0x74) {
        return false;
      }
      lookahead._2_2_ = 0x6e;
      break;
    case 0x6b:
      lexer->result_symbol = 0x14;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x6c:
      lexer->result_symbol = 0x36;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x6d:
      lexer->result_symbol = 0x40;
      (*lexer->mark_end)(lexer);
      return true;
    case 0x6e:
      if (uVar1 != 0x65) {
        return false;
      }
      lookahead._2_2_ = 0x6f;
      break;
    case 0x6f:
      lexer->result_symbol = 0x41;
      (*lexer->mark_end)(lexer);
      return true;
    default:
      return false;
    }
LAB_00105ab1:
    (*lexer->advance)(lexer,lookahead._0_1_);
  } while( true );
}

Assistant:

static bool ts_lex_keywords(TSLexer *lexer, TSStateId state) {
  START_LEXER();
  eof = lexer->eof(lexer);
  switch (state) {
    case 0:
      ADVANCE_MAP(
        'Q', 1,
        'a', 2,
        'b', 3,
        'c', 4,
        'd', 5,
        'e', 6,
        'f', 7,
        'i', 8,
        'l', 9,
        'm', 10,
        'n', 11,
        'o', 12,
        'q', 13,
        'r', 14,
        't', 15,
        'u', 16,
        'w', 17,
      );
      if (('\t' <= lookahead && lookahead <= '\r') ||
          lookahead == ' ') SKIP(0);
      END_STATE();
    case 1:
      if (lookahead == 'U') ADVANCE(18);
      END_STATE();
    case 2:
      if (lookahead == 'n') ADVANCE(19);
      if (lookahead == 't') ADVANCE(20);
      END_STATE();
    case 3:
      if (lookahead == 'r') ADVANCE(21);
      END_STATE();
    case 4:
      if (lookahead == 'o') ADVANCE(22);
      END_STATE();
    case 5:
      if (lookahead == 'o') ADVANCE(23);
      END_STATE();
    case 6:
      if (lookahead == 'l') ADVANCE(24);
      if (lookahead == 'n') ADVANCE(25);
      END_STATE();
    case 7:
      if (lookahead == 'a') ADVANCE(26);
      if (lookahead == 'i') ADVANCE(27);
      if (lookahead == 'o') ADVANCE(28);
      if (lookahead == 'u') ADVANCE(29);
      END_STATE();
    case 8:
      if (lookahead == 'f') ADVANCE(30);
      if (lookahead == 'n') ADVANCE(31);
      END_STATE();
    case 9:
      if (lookahead == 'o') ADVANCE(32);
      END_STATE();
    case 10:
      if (lookahead == 'o') ADVANCE(33);
      END_STATE();
    case 11:
      if (lookahead == 'o') ADVANCE(34);
      END_STATE();
    case 12:
      if (lookahead == 'd') ADVANCE(35);
      if (lookahead == 'r') ADVANCE(36);
      END_STATE();
    case 13:
      if (lookahead == 'u') ADVANCE(37);
      END_STATE();
    case 14:
      if (lookahead == 'e') ADVANCE(38);
      END_STATE();
    case 15:
      if (lookahead == 'h') ADVANCE(39);
      if (lookahead == 'r') ADVANCE(40);
      END_STATE();
    case 16:
      if (lookahead == 'n') ADVANCE(41);
      END_STATE();
    case 17:
      if (lookahead == 'h') ADVANCE(42);
      END_STATE();
    case 18:
      if (lookahead == 'I') ADVANCE(43);
      END_STATE();
    case 19:
      if (lookahead == 'd') ADVANCE(44);
      END_STATE();
    case 20:
      if (lookahead == 'o') ADVANCE(45);
      END_STATE();
    case 21:
      if (lookahead == 'e') ADVANCE(46);
      END_STATE();
    case 22:
      if (lookahead == 'n') ADVANCE(47);
      END_STATE();
    case 23:
      ACCEPT_TOKEN(anon_sym_do);
      END_STATE();
    case 24:
      if (lookahead == 'i') ADVANCE(48);
      if (lookahead == 's') ADVANCE(49);
      END_STATE();
    case 25:
      if (lookahead == 'd') ADVANCE(50);
      END_STATE();
    case 26:
      if (lookahead == 'i') ADVANCE(51);
      if (lookahead == 'l') ADVANCE(52);
      END_STATE();
    case 27:
      ACCEPT_TOKEN(anon_sym_fi);
      END_STATE();
    case 28:
      if (lookahead == 'r') ADVANCE(53);
      END_STATE();
    case 29:
      if (lookahead == 'n') ADVANCE(54);
      END_STATE();
    case 30:
      ACCEPT_TOKEN(anon_sym_if);
      END_STATE();
    case 31:
      ACCEPT_TOKEN(anon_sym_in);
      END_STATE();
    case 32:
      if (lookahead == 'c') ADVANCE(55);
      END_STATE();
    case 33:
      if (lookahead == 'd') ADVANCE(56);
      END_STATE();
    case 34:
      if (lookahead == 't') ADVANCE(57);
      END_STATE();
    case 35:
      ACCEPT_TOKEN(anon_sym_od);
      END_STATE();
    case 36:
      ACCEPT_TOKEN(anon_sym_or);
      END_STATE();
    case 37:
      if (lookahead == 'i') ADVANCE(58);
      END_STATE();
    case 38:
      if (lookahead == 'a') ADVANCE(59);
      if (lookahead == 'c') ADVANCE(60);
      if (lookahead == 'p') ADVANCE(61);
      if (lookahead == 't') ADVANCE(62);
      END_STATE();
    case 39:
      if (lookahead == 'e') ADVANCE(63);
      END_STATE();
    case 40:
      if (lookahead == 'u') ADVANCE(64);
      END_STATE();
    case 41:
      if (lookahead == 't') ADVANCE(65);
      END_STATE();
    case 42:
      if (lookahead == 'i') ADVANCE(66);
      END_STATE();
    case 43:
      if (lookahead == 'T') ADVANCE(67);
      END_STATE();
    case 44:
      ACCEPT_TOKEN(anon_sym_and);
      END_STATE();
    case 45:
      if (lookahead == 'm') ADVANCE(68);
      END_STATE();
    case 46:
      if (lookahead == 'a') ADVANCE(69);
      END_STATE();
    case 47:
      if (lookahead == 't') ADVANCE(70);
      END_STATE();
    case 48:
      if (lookahead == 'f') ADVANCE(71);
      END_STATE();
    case 49:
      if (lookahead == 'e') ADVANCE(72);
      END_STATE();
    case 50:
      ACCEPT_TOKEN(anon_sym_end);
      END_STATE();
    case 51:
      if (lookahead == 'l') ADVANCE(73);
      END_STATE();
    case 52:
      if (lookahead == 's') ADVANCE(74);
      END_STATE();
    case 53:
      ACCEPT_TOKEN(anon_sym_for);
      END_STATE();
    case 54:
      if (lookahead == 'c') ADVANCE(75);
      END_STATE();
    case 55:
      if (lookahead == 'a') ADVANCE(76);
      END_STATE();
    case 56:
      ACCEPT_TOKEN(anon_sym_mod);
      END_STATE();
    case 57:
      ACCEPT_TOKEN(anon_sym_not);
      END_STATE();
    case 58:
      if (lookahead == 't') ADVANCE(67);
      END_STATE();
    case 59:
      if (lookahead == 'd') ADVANCE(77);
      END_STATE();
    case 60:
      ACCEPT_TOKEN(anon_sym_rec);
      END_STATE();
    case 61:
      if (lookahead == 'e') ADVANCE(78);
      END_STATE();
    case 62:
      if (lookahead == 'u') ADVANCE(79);
      END_STATE();
    case 63:
      if (lookahead == 'n') ADVANCE(80);
      END_STATE();
    case 64:
      if (lookahead == 'e') ADVANCE(81);
      END_STATE();
    case 65:
      if (lookahead == 'i') ADVANCE(82);
      END_STATE();
    case 66:
      if (lookahead == 'l') ADVANCE(83);
      END_STATE();
    case 67:
      ACCEPT_TOKEN(sym_quit_statement);
      END_STATE();
    case 68:
      if (lookahead == 'i') ADVANCE(84);
      END_STATE();
    case 69:
      if (lookahead == 'k') ADVANCE(85);
      END_STATE();
    case 70:
      if (lookahead == 'i') ADVANCE(86);
      END_STATE();
    case 71:
      ACCEPT_TOKEN(anon_sym_elif);
      END_STATE();
    case 72:
      ACCEPT_TOKEN(anon_sym_else);
      END_STATE();
    case 73:
      ACCEPT_TOKEN(anon_sym_fail);
      END_STATE();
    case 74:
      if (lookahead == 'e') ADVANCE(87);
      END_STATE();
    case 75:
      if (lookahead == 't') ADVANCE(88);
      END_STATE();
    case 76:
      if (lookahead == 'l') ADVANCE(89);
      END_STATE();
    case 77:
      if (lookahead == 'o') ADVANCE(90);
      if (lookahead == 'w') ADVANCE(91);
      END_STATE();
    case 78:
      if (lookahead == 'a') ADVANCE(92);
      END_STATE();
    case 79:
      if (lookahead == 'r') ADVANCE(93);
      END_STATE();
    case 80:
      ACCEPT_TOKEN(anon_sym_then);
      END_STATE();
    case 81:
      ACCEPT_TOKEN(anon_sym_true);
      END_STATE();
    case 82:
      if (lookahead == 'l') ADVANCE(94);
      END_STATE();
    case 83:
      if (lookahead == 'e') ADVANCE(95);
      END_STATE();
    case 84:
      if (lookahead == 'c') ADVANCE(96);
      END_STATE();
    case 85:
      ACCEPT_TOKEN(sym_break_statement);
      END_STATE();
    case 86:
      if (lookahead == 'n') ADVANCE(97);
      END_STATE();
    case 87:
      ACCEPT_TOKEN(anon_sym_false);
      END_STATE();
    case 88:
      if (lookahead == 'i') ADVANCE(98);
      END_STATE();
    case 89:
      ACCEPT_TOKEN(anon_sym_local);
      END_STATE();
    case 90:
      if (lookahead == 'n') ADVANCE(99);
      END_STATE();
    case 91:
      if (lookahead == 'r') ADVANCE(100);
      END_STATE();
    case 92:
      if (lookahead == 't') ADVANCE(101);
      END_STATE();
    case 93:
      if (lookahead == 'n') ADVANCE(102);
      END_STATE();
    case 94:
      ACCEPT_TOKEN(anon_sym_until);
      END_STATE();
    case 95:
      ACCEPT_TOKEN(anon_sym_while);
      END_STATE();
    case 96:
      ACCEPT_TOKEN(anon_sym_atomic);
      END_STATE();
    case 97:
      if (lookahead == 'u') ADVANCE(103);
      END_STATE();
    case 98:
      if (lookahead == 'o') ADVANCE(104);
      END_STATE();
    case 99:
      if (lookahead == 'l') ADVANCE(105);
      END_STATE();
    case 100:
      if (lookahead == 'i') ADVANCE(106);
      END_STATE();
    case 101:
      ACCEPT_TOKEN(anon_sym_repeat);
      END_STATE();
    case 102:
      ACCEPT_TOKEN(anon_sym_return);
      END_STATE();
    case 103:
      if (lookahead == 'e') ADVANCE(107);
      END_STATE();
    case 104:
      if (lookahead == 'n') ADVANCE(108);
      END_STATE();
    case 105:
      if (lookahead == 'y') ADVANCE(109);
      END_STATE();
    case 106:
      if (lookahead == 't') ADVANCE(110);
      END_STATE();
    case 107:
      ACCEPT_TOKEN(sym_continue_statement);
      END_STATE();
    case 108:
      ACCEPT_TOKEN(anon_sym_function);
      END_STATE();
    case 109:
      ACCEPT_TOKEN(anon_sym_readonly);
      END_STATE();
    case 110:
      if (lookahead == 'e') ADVANCE(111);
      END_STATE();
    case 111:
      ACCEPT_TOKEN(anon_sym_readwrite);
      END_STATE();
    default:
      return false;
  }
}